

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.h
# Opt level: O0

StopPositionRequest * __thiscall
aeron::archive::ArchiveProxy::wrapAndApplyHeader<io::aeron::archive::codecs::StopPositionRequest>
          (ArchiveProxy *this,StopPositionRequest *msg)

{
  uint16_t uVar1;
  index_t iVar2;
  uint8_t *puVar3;
  MessageHeader *pMVar4;
  uint64_t offset_00;
  StopPositionRequest *pSVar5;
  undefined1 local_40 [8];
  MessageHeader hdr;
  uint64_t offset;
  StopPositionRequest *msg_local;
  ArchiveProxy *this_local;
  
  hdr.m_actingVersion = 0;
  io::aeron::archive::codecs::MessageHeader::MessageHeader((MessageHeader *)local_40);
  puVar3 = concurrent::AtomicBuffer::buffer(&this->buffer_);
  iVar2 = concurrent::AtomicBuffer::capacity(&this->buffer_);
  pMVar4 = io::aeron::archive::codecs::MessageHeader::wrap
                     ((MessageHeader *)local_40,(char *)puVar3,0,0,(long)iVar2);
  uVar1 = io::aeron::archive::codecs::StopPositionRequest::sbeBlockLength();
  pMVar4 = io::aeron::archive::codecs::MessageHeader::blockLength(pMVar4,uVar1);
  uVar1 = io::aeron::archive::codecs::StopPositionRequest::sbeTemplateId();
  pMVar4 = io::aeron::archive::codecs::MessageHeader::templateId(pMVar4,uVar1);
  uVar1 = io::aeron::archive::codecs::StopPositionRequest::sbeSchemaId();
  pMVar4 = io::aeron::archive::codecs::MessageHeader::schemaId(pMVar4,uVar1);
  uVar1 = io::aeron::archive::codecs::StopPositionRequest::sbeSchemaVersion();
  io::aeron::archive::codecs::MessageHeader::version(pMVar4,uVar1);
  puVar3 = concurrent::AtomicBuffer::buffer(&this->buffer_);
  offset_00 = io::aeron::archive::codecs::MessageHeader::encodedLength();
  iVar2 = concurrent::AtomicBuffer::capacity(&this->buffer_);
  pSVar5 = io::aeron::archive::codecs::StopPositionRequest::wrapForEncode
                     (msg,(char *)puVar3,offset_00,(long)iVar2);
  return pSVar5;
}

Assistant:

T& wrapAndApplyHeader(T& msg) {
        constexpr std::uint64_t offset{0};
        io::aeron::archive::codecs::MessageHeader hdr;

        hdr.wrap((char*)buffer_.buffer(), offset, 0, buffer_.capacity())
            .blockLength(T::sbeBlockLength())
            .templateId(T::sbeTemplateId())
            .schemaId(T::sbeSchemaId())
            .version(T::sbeSchemaVersion());

        return msg.wrapForEncode((char*)buffer_.buffer(), offset + hdr.encodedLength(), buffer_.capacity());
    }